

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::CommissionerImpl::MakeChannelMask
                  (Error *__return_storage_ptr__,ByteArray *aBuf,uint32_t aChannelMask)

{
  undefined4 uVar1;
  pointer *__dest;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar3;
  size_t __n;
  format_args args;
  initializer_list<ot::commissioner::ChannelMaskEntry> __l;
  ChannelMaskEntry entry;
  allocator_type local_d1;
  undefined1 local_d0;
  ByteArray local_c8;
  undefined1 local_b0 [32];
  undefined1 local_90 [8];
  pointer *local_88;
  pointer local_80;
  pointer local_78 [2];
  undefined1 local_68 [40];
  parse_func local_40 [1];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((aChannelMask & 0x7fff800) != 0) {
    local_d0 = 0;
    utils::Encode<unsigned_int>(&local_c8,0x7fff800);
    if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_90[0] = local_d0;
      uVar3 = (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if ((long)uVar3 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer *)operator_new(uVar3);
      local_78[0] = (pointer)((long)__dest + uVar3);
      __n = (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      local_88 = __dest;
      if (__n != 0) {
        memmove(__dest,local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
      }
      local_80 = (pointer)((long)__dest + __n);
      __l._M_len = 1;
      __l._M_array = (iterator)local_90;
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                *)local_b0,__l,&local_d1);
      EncodeChannelMask((Error *)local_68,aBuf,(ChannelMask *)local_b0);
      uVar1 = local_68._0_4_;
      if ((undefined1 *)local_68._8_8_ != local_68 + 0x18) {
        operator_delete((void *)local_68._8_8_);
      }
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                 *)local_b0);
      if (local_88 != (pointer *)0x0) {
        operator_delete(local_88);
      }
      if (uVar1 != none_type) {
        abort();
      }
      goto LAB_0019d234;
    }
  }
  local_68._0_4_ = none_type;
  local_68._8_8_ = "no valid Channel Masks provided";
  local_68._16_8_ = 0x1f;
  local_68._24_8_ = 0;
  local_40[0] = (parse_func)0x0;
  begin = "no valid Channel Masks provided";
  local_68._32_8_ = (format_string_checker<char> *)local_68;
  do {
    pcVar2 = begin + 1;
    if (*begin == '}') {
      if ((pcVar2 == "") || (*pcVar2 != '}')) {
        fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar2 = begin + 2;
    }
    else if (*begin == '{') {
      pcVar2 = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (begin,"",(format_string_checker<char> *)local_68);
    }
    begin = pcVar2;
  } while (pcVar2 != "");
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_68;
  fmt::v10::vformat_abi_cxx11_
            ((string *)local_b0,(v10 *)"no valid Channel Masks provided",(string_view)ZEXT816(0x1f),
             args);
  local_90._0_4_ = kInvalidArgs;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_b0._0_8_,
             (pointer)(local_b0._0_8_ + (long)(uint8_t *)local_b0._8_8_));
  __return_storage_ptr__->mCode = local_90._0_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_88);
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if ((pointer)local_b0._0_8_ != (pointer)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_);
  }
LAB_0019d234:
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::MakeChannelMask(ByteArray &aBuf, uint32_t aChannelMask)
{
    Error            error;
    ChannelMaskEntry entry;

    if (kRadio915Mhz)
    {
        if (aChannelMask & kRadio915MhzOqpskChannelMask)
        {
            entry.mPage = kRadioChannelPage2;
            utils::Encode(entry.mMasks, kRadio915MhzOqpskChannelMask);
        }
    }
    else
    {
        if (aChannelMask & kRadio2P4GhzOqpskChannelMask)
        {
            entry.mPage = kRadioChannelPage0;
            utils::Encode(entry.mMasks, kRadio2P4GhzOqpskChannelMask);
        }
    }

    VerifyOrExit(!entry.mMasks.empty(), error = ERROR_INVALID_ARGS("no valid Channel Masks provided"));
    SuccessOrDie(EncodeChannelMask(aBuf, {entry}));

exit:
    return error;
}